

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlElementType xVar1;
  xmlXPathObjectPtr pxVar2;
  xmlXPathObjectPtr pxVar3;
  int i;
  xmlXPathObjectPtr cur;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    cur._4_4_ = nargs;
    if (nargs == 0) {
      pxVar2 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
      xmlXPathValuePush(ctxt,pxVar2);
      cur._4_4_ = 1;
    }
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      if (cur._4_4_ == 1) {
        if (ctxt->valueNr < 1) {
          xmlXPathErr(ctxt,0x17);
        }
        else if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
                ((ctxt->value->type != XPATH_NODESET && (ctxt->value->type != XPATH_XSLT_TREE)))) {
          xmlXPathErr(ctxt,0xb);
        }
        else {
          pxVar2 = xmlXPathValuePop(ctxt);
          if ((pxVar2->nodesetval == (xmlNodeSetPtr)0x0) || (pxVar2->nodesetval->nodeNr == 0)) {
            pxVar3 = xmlXPathCacheNewCString(ctxt,"");
            xmlXPathValuePush(ctxt,pxVar3);
          }
          else {
            xVar1 = (*pxVar2->nodesetval->nodeTab)->type;
            if ((xVar1 - XML_ELEMENT_NODE < 2) || (xVar1 == XML_PI_NODE)) {
              if (*(*pxVar2->nodesetval->nodeTab)->name == ' ') {
                pxVar3 = xmlXPathCacheNewCString(ctxt,"");
                xmlXPathValuePush(ctxt,pxVar3);
              }
              else {
                pxVar3 = xmlXPathCacheNewString(ctxt,(*pxVar2->nodesetval->nodeTab)->name);
                xmlXPathValuePush(ctxt,pxVar3);
              }
            }
            else if (xVar1 == XML_NAMESPACE_DECL) {
              pxVar3 = xmlXPathCacheNewString
                                 (ctxt,(xmlChar *)(*pxVar2->nodesetval->nodeTab)->children);
              xmlXPathValuePush(ctxt,pxVar3);
            }
            else {
              pxVar3 = xmlXPathCacheNewCString(ctxt,"");
              xmlXPathValuePush(ctxt,pxVar3);
            }
          }
          xmlXPathReleaseObject(ctxt->context,pxVar2);
        }
      }
      else {
        xmlXPathErr(ctxt,0xc);
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;

    if (nargs == 0) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt, ctxt->context->node));
	nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    } else {
	int i = 0; /* Should be first in document order !!!!! */
	switch (cur->nodesetval->nodeTab[i]->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	case XML_PI_NODE:
	    if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	    else
		xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			cur->nodesetval->nodeTab[i]->name));
	    break;
	case XML_NAMESPACE_DECL:
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			((xmlNsPtr)cur->nodesetval->nodeTab[i])->prefix));
	    break;
	default:
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	}
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}